

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int EVP_EncodeBlock(uchar *t,uchar *f,int n)

{
  byte bVar1;
  byte a;
  uint8_t uVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  uint uVar4;
  byte *pbVar5;
  long lVar6;
  
  uVar3 = CONCAT44(in_register_00000014,n);
  pbVar5 = f + 2;
  lVar6 = 0;
  while (uVar3 != 0) {
    uVar4 = (uint)pbVar5[-2] << 0x10;
    if (uVar3 < 3) {
      if (uVar3 == 2) {
        uVar4 = uVar4 | (uint)pbVar5[-1] << 8;
      }
      uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 0x12));
      t[lVar6] = uVar2;
      uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 0xc));
      t[lVar6 + 1] = uVar2;
      if (uVar3 == 1) {
        uVar2 = '=';
      }
      else {
        uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 6));
      }
      t[lVar6 + 2] = uVar2;
      t[lVar6 + 3] = '=';
      uVar3 = 0;
    }
    else {
      bVar1 = pbVar5[-1];
      a = *pbVar5;
      uVar2 = conv_bin2ascii(pbVar5[-2] >> 2);
      t[lVar6] = uVar2;
      uVar2 = conv_bin2ascii((uint8_t)(((uint)bVar1 * 0x100 | uVar4) >> 0xc));
      t[lVar6 + 1] = uVar2;
      uVar2 = conv_bin2ascii((uint8_t)((uint)a + (uint)bVar1 * 0x100 >> 6));
      t[lVar6 + 2] = uVar2;
      uVar2 = conv_bin2ascii(a);
      t[lVar6 + 3] = uVar2;
      uVar3 = uVar3 - 3;
    }
    lVar6 = lVar6 + 4;
    pbVar5 = pbVar5 + 3;
  }
  t[lVar6] = '\0';
  return (int)lVar6;
}

Assistant:

size_t EVP_EncodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  uint32_t l;
  size_t remaining = src_len, ret = 0;

  while (remaining) {
    if (remaining >= 3) {
      l = (((uint32_t)src[0]) << 16L) | (((uint32_t)src[1]) << 8L) | src[2];
      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = conv_bin2ascii(l >> 6L);
      *(dst++) = conv_bin2ascii(l);
      remaining -= 3;
    } else {
      l = ((uint32_t)src[0]) << 16L;
      if (remaining == 2) {
        l |= ((uint32_t)src[1] << 8L);
      }

      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = (remaining == 1) ? '=' : conv_bin2ascii(l >> 6L);
      *(dst++) = '=';
      remaining = 0;
    }
    ret += 4;
    src += 3;
  }

  *dst = '\0';
  return ret;
}